

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::TraverseShaderRec<tinyusdz::UsdPreviewSurface>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathShaderMap<tinyusdz::UsdPreviewSurface> *itemmap)

{
  pointer pPVar1;
  bool bVar2;
  Shader *pSVar3;
  UsdPreviewSurface *pUVar4;
  mapped_type *pmVar5;
  Prim *child;
  pointer prim_00;
  bool bVar6;
  string prim_abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (depth < 0x20001) {
    ::std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     path_prefix,"/");
    Path::full_path_name_abi_cxx11_(&local_70,&prim->_path);
    ::std::operator+(&local_90,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pSVar3 = Prim::as<tinyusdz::Shader>(prim);
    if (pSVar3 != (Shader *)0x0) {
      pUVar4 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&pSVar3->value,false);
      if (pUVar4 != (UsdPreviewSurface *)0x0) {
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPreviewSurface_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPreviewSurface_*>_>_>_>
                 ::operator[](itemmap,(key_type *)&local_90);
        pmVar5->first = pSVar3;
        pmVar5->second = pUVar4;
      }
    }
    prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar6 = prim_00 == pPVar1;
      if (bVar6) break;
      bVar2 = TraverseShaderRec<tinyusdz::UsdPreviewSurface>
                        ((string *)&local_90,prim_00,depth + 1,itemmap);
      prim_00 = prim_00 + 1;
    } while (bVar2);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool TraverseShaderRec(const std::string &path_prefix,
                       const tinyusdz::Prim &prim, uint32_t depth,
                       PathShaderMap<ShaderTy> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  // First check if type is Shader Prim.
  if (const Shader *ps = prim.as<Shader>()) {
    // Then check if wanted Shder type
    if (const ShaderTy *s = ps->value.as<ShaderTy>()) {
      itemmap[prim_abs_path] = std::make_pair(ps, s);
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseShaderRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}